

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  FieldType FVar1;
  int iVar2;
  int iVar3;
  uint32_t value;
  const_reference puVar4;
  const_reference puVar5;
  const_reference piVar6;
  const_reference plVar7;
  LogMessage *pLVar8;
  size_t sVar9;
  size_t sVar10;
  const_reference pbVar11;
  const_reference pMVar12;
  size_t local_1f8;
  int local_94;
  int local_90;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  size_t tag_size;
  LogMessageFatal local_50 [19];
  Voidify local_3d;
  int local_3c;
  int local_38;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  size_t result;
  Extension *pEStack_10;
  int number_local;
  Extension *this_local;
  
  _i_1 = 0;
  result._4_4_ = number;
  pEStack_10 = this;
  if ((this->is_repeated & 1U) == 0) {
    if (((byte)this->field_0xa >> 1 & 1) == 0) {
      FVar1 = anon_unknown_58::real_type(this->type);
      sVar9 = WireFormatLite::TagSize(number,FVar1);
      _i_1 = _i_1 + sVar9;
      FVar1 = anon_unknown_58::real_type(this->type);
      switch(FVar1) {
      case TYPE_DOUBLE:
        _i_1 = _i_1 + 8;
        break;
      case TYPE_FLOAT:
        _i_1 = _i_1 + 4;
        break;
      case TYPE_INT64:
        sVar9 = WireFormatLite::Int64Size((this->field_0).int64_t_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_UINT64:
        sVar9 = WireFormatLite::UInt64Size((this->field_0).uint64_t_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_INT32:
        sVar9 = WireFormatLite::Int32Size((this->field_0).int32_t_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_FIXED64:
        _i_1 = _i_1 + 8;
        break;
      case TYPE_FIXED32:
        _i_1 = _i_1 + 4;
        break;
      case TYPE_BOOL:
        _i_1 = _i_1 + 1;
        break;
      case TYPE_STRING:
        sVar9 = WireFormatLite::StringSize((string *)this->field_0);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_GROUP:
        sVar9 = WireFormatLite::GroupSize<google::protobuf::MessageLite>
                          ((MessageLite *)this->field_0);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_MESSAGE:
        if (((byte)this->field_0xa >> 2 & 1) == 0) {
          local_1f8 = (**(code **)(*(long *)this->field_0 + 0x18))();
        }
        else {
          local_1f8 = (**(code **)(*(long *)this->field_0 + 0x68))();
        }
        sVar9 = WireFormatLite::LengthDelimitedSize(local_1f8);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_BYTES:
        sVar9 = WireFormatLite::BytesSize((string *)this->field_0);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_UINT32:
        sVar9 = WireFormatLite::UInt32Size((this->field_0).uint32_t_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_ENUM:
        sVar9 = WireFormatLite::EnumSize((this->field_0).enum_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_SFIXED32:
        _i_1 = _i_1 + 4;
        break;
      case TYPE_SFIXED64:
        _i_1 = _i_1 + 8;
        break;
      case TYPE_SINT32:
        sVar9 = WireFormatLite::SInt32Size((this->field_0).int32_t_value);
        _i_1 = sVar9 + _i_1;
        break;
      case MAX_FIELD_TYPE:
        sVar9 = WireFormatLite::SInt64Size((this->field_0).int64_t_value);
        _i_1 = sVar9 + _i_1;
      }
    }
  }
  else if ((this->is_packed & 1U) == 0) {
    FVar1 = anon_unknown_58::real_type(this->type);
    sVar9 = WireFormatLite::TagSize(number,FVar1);
    FVar1 = anon_unknown_58::real_type(this->type);
    switch(FVar1) {
    case TYPE_DOUBLE:
      iVar3 = RepeatedField<double>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 8) * sVar10 + _i_1;
      break;
    case TYPE_FLOAT:
      iVar3 = RepeatedField<float>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 4) * sVar10 + _i_1;
      break;
    case TYPE_INT64:
      iVar3 = RepeatedField<long>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_10 = 0; iVar3 = RepeatedField<long>::size(this->field_0), i_10 < iVar3; i_10 = i_10 + 1
          ) {
        plVar7 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,i_10);
        sVar9 = WireFormatLite::Int64Size(*plVar7);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_UINT64:
      iVar3 = RepeatedField<unsigned_long>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_12 = 0; iVar3 = RepeatedField<unsigned_long>::size(this->field_0), i_12 < iVar3;
          i_12 = i_12 + 1) {
        puVar5 = RepeatedField<unsigned_long>::Get
                           ((RepeatedField<unsigned_long> *)this->field_0,i_12);
        sVar9 = WireFormatLite::UInt64Size(*puVar5);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_INT32:
      iVar3 = RepeatedField<int>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_9 = 0; iVar3 = RepeatedField<int>::size(this->field_0), i_9 < iVar3; i_9 = i_9 + 1) {
        piVar6 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_9);
        sVar9 = WireFormatLite::Int32Size(*piVar6);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_FIXED64:
      iVar3 = RepeatedField<unsigned_long>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 8) * sVar10 + _i_1;
      break;
    case TYPE_FIXED32:
      iVar3 = RepeatedField<unsigned_int>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 4) * sVar10 + _i_1;
      break;
    case TYPE_BOOL:
      iVar3 = RepeatedField<bool>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 1) * sVar10 + _i_1;
      break;
    case TYPE_STRING:
      iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_15 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size(this->field_0), i_15 < iVar3; i_15 = i_15 + 1) {
        pbVar11 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this->field_0,i_15);
        sVar9 = WireFormatLite::StringSize(pbVar11);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_GROUP:
      iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (local_90 = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size(this->field_0),
          local_90 < iVar3; local_90 = local_90 + 1) {
        pMVar12 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((RepeatedPtrField<google::protobuf::MessageLite> *)this->field_0,
                             local_90);
        sVar9 = WireFormatLite::GroupSize<google::protobuf::MessageLite>(pMVar12);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_MESSAGE:
      iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (local_94 = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size(this->field_0),
          local_94 < iVar3; local_94 = local_94 + 1) {
        pMVar12 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((RepeatedPtrField<google::protobuf::MessageLite> *)this->field_0,
                             local_94);
        sVar9 = WireFormatLite::MessageSize<google::protobuf::MessageLite>(pMVar12);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_BYTES:
      iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_16 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size(this->field_0), i_16 < iVar3; i_16 = i_16 + 1) {
        pbVar11 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this->field_0,i_16);
        sVar9 = WireFormatLite::BytesSize(pbVar11);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_UINT32:
      iVar3 = RepeatedField<unsigned_int>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_11 = 0; iVar3 = RepeatedField<unsigned_int>::size(this->field_0), i_11 < iVar3;
          i_11 = i_11 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)this->field_0,i_11)
        ;
        sVar9 = WireFormatLite::UInt32Size(*puVar4);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_ENUM:
      iVar3 = RepeatedField<int>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_17 = 0; iVar3 = RepeatedField<int>::size(this->field_0), i_17 < iVar3; i_17 = i_17 + 1)
      {
        piVar6 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_17);
        sVar9 = WireFormatLite::EnumSize(*piVar6);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_SFIXED32:
      iVar3 = RepeatedField<int>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 4) * sVar10 + _i_1;
      break;
    case TYPE_SFIXED64:
      iVar3 = RepeatedField<long>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 8) * sVar10 + _i_1;
      break;
    case TYPE_SINT32:
      iVar3 = RepeatedField<int>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_13 = 0; iVar3 = RepeatedField<int>::size(this->field_0), i_13 < iVar3; i_13 = i_13 + 1)
      {
        piVar6 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_13);
        sVar9 = WireFormatLite::SInt32Size(*piVar6);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case MAX_FIELD_TYPE:
      iVar3 = RepeatedField<long>::size(this->field_0);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_14 = 0; iVar3 = RepeatedField<long>::size(this->field_0), i_14 < iVar3; i_14 = i_14 + 1
          ) {
        plVar7 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,i_14);
        sVar9 = WireFormatLite::SInt64Size(*plVar7);
        _i_1 = sVar9 + _i_1;
      }
    }
  }
  else {
    FVar1 = anon_unknown_58::real_type(this->type);
    switch(FVar1) {
    case TYPE_DOUBLE:
      iVar3 = RepeatedField<double>::size(this->field_0);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 8 + _i_1;
      break;
    case TYPE_FLOAT:
      iVar3 = RepeatedField<float>::size(this->field_0);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 4 + _i_1;
      break;
    case TYPE_INT64:
      for (i_3 = 0; iVar3 = i_3, iVar2 = RepeatedField<long>::size(this->field_0), iVar3 < iVar2;
          i_3 = i_3 + 1) {
        plVar7 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,i_3);
        sVar9 = WireFormatLite::Int64Size(*plVar7);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_UINT64:
      for (i_5 = 0; iVar3 = i_5, iVar2 = RepeatedField<unsigned_long>::size(this->field_0),
          iVar3 < iVar2; i_5 = i_5 + 1) {
        puVar5 = RepeatedField<unsigned_long>::Get
                           ((RepeatedField<unsigned_long> *)this->field_0,i_5);
        sVar9 = WireFormatLite::UInt64Size(*puVar5);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_INT32:
      for (i_2 = 0; iVar3 = i_2, iVar2 = RepeatedField<int>::size(this->field_0), iVar3 < iVar2;
          i_2 = i_2 + 1) {
        piVar6 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_2);
        sVar9 = WireFormatLite::Int32Size(*piVar6);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_FIXED64:
      iVar3 = RepeatedField<unsigned_long>::size(this->field_0);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 8 + _i_1;
      break;
    case TYPE_FIXED32:
      iVar3 = RepeatedField<unsigned_int>::size(this->field_0);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 4 + _i_1;
      break;
    case TYPE_BOOL:
      iVar3 = RepeatedField<bool>::size(this->field_0);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 + _i_1;
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x592);
      pLVar8 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
      pLVar8 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar8,(char (*) [37])"Non-primitive types can\'t be packed.");
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_3d,pLVar8);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
    case TYPE_UINT32:
      for (i_4 = 0; iVar3 = i_4, iVar2 = RepeatedField<unsigned_int>::size(this->field_0),
          iVar3 < iVar2; i_4 = i_4 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)this->field_0,i_4);
        sVar9 = WireFormatLite::UInt32Size(*puVar4);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_ENUM:
      for (local_3c = 0; iVar3 = local_3c, iVar2 = RepeatedField<int>::size(this->field_0),
          iVar3 < iVar2; local_3c = local_3c + 1) {
        piVar6 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,local_3c);
        sVar9 = WireFormatLite::EnumSize(*piVar6);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_SFIXED32:
      iVar3 = RepeatedField<int>::size(this->field_0);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 4 + _i_1;
      break;
    case TYPE_SFIXED64:
      iVar3 = RepeatedField<long>::size(this->field_0);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 8 + _i_1;
      break;
    case TYPE_SINT32:
      for (i_6 = 0; iVar3 = i_6, iVar2 = RepeatedField<int>::size(this->field_0), iVar3 < iVar2;
          i_6 = i_6 + 1) {
        piVar6 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,i_6);
        sVar9 = WireFormatLite::SInt32Size(*piVar6);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case MAX_FIELD_TYPE:
      for (local_38 = 0; iVar3 = local_38, iVar2 = RepeatedField<long>::size(this->field_0),
          iVar3 < iVar2; local_38 = local_38 + 1) {
        plVar7 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,local_38);
        sVar9 = WireFormatLite::SInt64Size(*plVar7);
        _i_1 = sVar9 + _i_1;
      }
    }
    iVar3 = ToCachedSize(_i_1);
    TrivialAtomicInt::set(&this->cached_size,iVar3);
    if (_i_1 != 0) {
      sVar9 = io::CodedOutputStream::VarintSize32((uint32_t)_i_1);
      _i_1 = sVar9 + _i_1;
      value = WireFormatLite::MakeTag(result._4_4_,WIRETYPE_LENGTH_DELIMITED);
      sVar9 = io::CodedOutputStream::VarintSize32(value);
      _i_1 = sVar9 + _i_1;
    }
  }
  return _i_1;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      result += WireFormatLite::CAMELCASE##Size(                         \
          ptr.repeated_##LOWERCASE##_value->Get(i));                     \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    result += WireFormatLite::k##CAMELCASE##Size *                   \
              FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size.set(ToCachedSize(result));
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                      \
  case WireFormatLite::TYPE_##UPPERCASE:                                  \
    result +=                                                             \
        tag_size * FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) {  \
      result += WireFormatLite::CAMELCASE##Size(                          \
          ptr.repeated_##LOWERCASE##_value->Get(i));                      \
    }                                                                     \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
        HANDLE_TYPE(ENUM, Enum, enum);
        HANDLE_TYPE(GROUP, Group, message);
        HANDLE_TYPE(MESSAGE, Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *      \
              FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)      \
  case WireFormatLite::TYPE_##UPPERCASE:                  \
    result += WireFormatLite::CAMELCASE##Size(LOWERCASE); \
    break

      HANDLE_TYPE(INT32, Int32, int32_t_value);
      HANDLE_TYPE(INT64, Int64, int64_t_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_t_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_t_value);
      HANDLE_TYPE(SINT32, SInt32, int32_t_value);
      HANDLE_TYPE(SINT64, SInt64, int64_t_value);
      HANDLE_TYPE(STRING, String, *ptr.string_value);
      HANDLE_TYPE(BYTES, Bytes, *ptr.string_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
      HANDLE_TYPE(GROUP, Group, *ptr.message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        result += WireFormatLite::LengthDelimitedSize(
            is_lazy ? ptr.lazymessage_value->ByteSizeLong()
                    : ptr.message_value->ByteSizeLong());
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)         \
  case WireFormatLite::TYPE_##UPPERCASE:          \
    result += WireFormatLite::k##CAMELCASE##Size; \
    break
        HANDLE_TYPE(FIXED32, Fixed32);
        HANDLE_TYPE(FIXED64, Fixed64);
        HANDLE_TYPE(SFIXED32, SFixed32);
        HANDLE_TYPE(SFIXED64, SFixed64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}